

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  void *pvVar36;
  void *pvVar37;
  long lVar38;
  long lVar39;
  undefined1 (*pauVar40) [16];
  size_t *psVar41;
  long lVar42;
  undefined1 (*pauVar43) [32];
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  undefined1 (*pauVar48) [32];
  long lVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  bool bVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  long local_148;
  long local_140;
  long local_128;
  long local_120;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_a0;
  
  psVar41 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar41 = &B->cstep;
  }
  iVar33 = (int)*psVar41;
  lVar58 = (long)iVar33;
  local_a0 = 0;
  iVar50 = 0;
  if (0 < max_kk) {
    iVar50 = max_kk;
  }
  lVar56 = (long)j;
  lVar9 = (long)k * 4;
  lVar38 = lVar9 + (lVar56 + 1) * lVar58 * 4;
  lVar39 = lVar9 + (lVar56 + 2) * lVar58 * 4;
  lVar54 = lVar9 + (lVar56 + 3) * lVar58 * 4;
  lVar52 = (lVar56 + 4) * lVar58;
  lVar1 = lVar9 + lVar58 * lVar56 * 4;
  lVar61 = (long)(k * 4) * 4;
  lVar46 = lVar61 + lVar58 * lVar56 * 4;
  lVar49 = lVar61 + lVar52 * 4;
  lVar52 = lVar9 + lVar52 * 4;
  lVar2 = lVar9 + (lVar56 + 5) * lVar58 * 4;
  lVar3 = lVar9 + (lVar56 + 6) * lVar58 * 4;
  lVar4 = lVar9 + (lVar56 + 7) * lVar58 * 4;
  lVar53 = (lVar56 + 8) * lVar58;
  lVar61 = lVar61 + lVar53 * 4;
  lVar5 = lVar9 + (lVar56 + 0xb) * lVar58 * 4;
  lVar6 = lVar9 + (lVar56 + 10) * lVar58 * 4;
  lVar7 = lVar9 + (lVar56 + 9) * lVar58 * 4;
  lVar9 = lVar9 + lVar53 * 4;
  pauVar48 = (undefined1 (*) [32])BT->data;
  lVar42 = (long)(k * 8);
  lVar34 = (long)max_jj;
  iVar15 = B->elempack;
  lVar35 = lVar58 * 0x30;
  lVar53 = lVar42 * 4;
  lVar47 = lVar7;
  lVar57 = lVar9;
  lVar59 = lVar5;
  lVar60 = lVar6;
  local_148 = lVar1;
  local_140 = lVar38;
  local_128 = lVar39;
  local_120 = lVar54;
  local_d8 = lVar52;
  local_d0 = lVar2;
  local_c8 = lVar3;
  local_c0 = lVar4;
  for (uVar55 = 0; (long)uVar55 < lVar34 + -0xb; uVar55 = uVar55 + 0xc) {
    if (iVar15 == 8) {
      iVar32 = j + (int)uVar55;
      iVar51 = iVar32 / 8;
      iVar32 = iVar32 % 8;
      pvVar36 = (void *)((long)B->data + (long)(iVar51 * 8 * iVar33) * 4);
      pvVar37 = (void *)((long)B->data + (long)((iVar51 * 8 + 8) * iVar33) * 4);
      iVar51 = iVar50;
      if (iVar32 == 0) {
        while (iVar51 != 0) {
          puVar10 = (undefined8 *)((long)pvVar36 + lVar53);
          uVar29 = puVar10[1];
          uVar30 = puVar10[2];
          uVar31 = puVar10[3];
          *(undefined8 *)*pauVar48 = *puVar10;
          *(undefined8 *)(*pauVar48 + 8) = uVar29;
          *(undefined8 *)(*pauVar48 + 0x10) = uVar30;
          *(undefined8 *)(*pauVar48 + 0x18) = uVar31;
          *(undefined1 (*) [16])pauVar48[1] = *(undefined1 (*) [16])((long)pvVar37 + lVar53);
          pauVar48 = (undefined1 (*) [32])(pauVar48[1] + 0x10);
          pvVar37 = (void *)((long)pvVar37 + 0x20);
          pvVar36 = (void *)((long)pvVar36 + 0x20);
          iVar51 = iVar51 + -1;
        }
        pvVar37 = (void *)((long)pvVar37 + lVar53);
        pvVar36 = (void *)((long)pvVar36 + lVar53);
      }
      else {
        pvVar36 = (void *)((long)pvVar36 + lVar42 * 4);
        pvVar37 = (void *)((long)pvVar37 + lVar42 * 4);
      }
      if (iVar32 == 4) {
        lVar44 = 0;
        iVar51 = iVar50;
        while (bVar62 = iVar51 != 0, iVar51 = iVar51 + -1, bVar62) {
          puVar10 = (undefined8 *)((long)pvVar36 + lVar44 + 0x10);
          uVar29 = puVar10[1];
          *(undefined8 *)*pauVar48 = *puVar10;
          *(undefined8 *)(*pauVar48 + 8) = uVar29;
          *(undefined1 (*) [32])(*pauVar48 + 0x10) = *(undefined1 (*) [32])((long)pvVar37 + lVar44);
          pauVar48 = (undefined1 (*) [32])(pauVar48[1] + 0x10);
          lVar44 = lVar44 + 0x20;
        }
      }
    }
    if (iVar15 == 4) {
      pvVar36 = B->data;
      iVar51 = iVar50;
      while (bVar62 = iVar51 != 0, iVar51 = iVar51 + -1, bVar62) {
        uVar29 = ((undefined8 *)((long)pvVar36 + lVar46))[1];
        *(undefined8 *)*pauVar48 = *(undefined8 *)((long)pvVar36 + lVar46);
        *(undefined8 *)(*pauVar48 + 8) = uVar29;
        uVar29 = ((undefined8 *)((long)pvVar36 + lVar49))[1];
        *(undefined8 *)(*pauVar48 + 0x10) = *(undefined8 *)((long)pvVar36 + lVar49);
        *(undefined8 *)(*pauVar48 + 0x18) = uVar29;
        *(undefined1 (*) [16])pauVar48[1] = *(undefined1 (*) [16])((long)pvVar36 + lVar61);
        pauVar48 = (undefined1 (*) [32])(pauVar48[1] + 0x10);
        pvVar36 = (void *)((long)pvVar36 + 0x10);
      }
    }
    if (iVar15 == 1) {
      pvVar36 = B->data;
      lVar44 = (long)pvVar36 + local_a0;
      lVar45 = 0;
      pvVar37 = pvVar36;
      for (iVar51 = 0; iVar51 + 7 < max_kk; iVar51 = iVar51 + 8) {
        auVar11 = *(undefined1 (*) [32])(lVar44 + lVar1);
        auVar63 = *(undefined1 (*) [32])(lVar44 + lVar38);
        auVar64 = *(undefined1 (*) [32])(lVar44 + lVar39);
        auVar12 = *(undefined1 (*) [32])(lVar44 + lVar54);
        auVar13 = *(undefined1 (*) [32])(lVar44 + lVar52);
        auVar65 = *(undefined1 (*) [32])(lVar44 + lVar2);
        auVar14 = *(undefined1 (*) [32])(lVar44 + lVar3);
        auVar66 = *(undefined1 (*) [32])(lVar44 + lVar4);
        auVar69 = *(undefined1 (*) [32])(lVar44 + lVar9);
        auVar68 = *(undefined1 (*) [32])(lVar44 + lVar7);
        auVar75 = *(undefined1 (*) [32])(lVar44 + lVar6);
        auVar67 = *(undefined1 (*) [32])(lVar44 + lVar5);
        auVar70 = vunpcklps_avx(auVar11,auVar63);
        auVar63 = vunpckhps_avx(auVar11,auVar63);
        auVar11 = vunpcklps_avx(auVar64,auVar12);
        auVar64 = vunpckhps_avx(auVar64,auVar12);
        auVar71 = vunpcklps_avx(auVar13,auVar65);
        auVar12 = vunpckhps_avx(auVar13,auVar65);
        auVar73 = vunpcklps_avx(auVar14,auVar66);
        auVar13 = vunpckhps_avx(auVar14,auVar66);
        auVar72 = vunpcklps_avx(auVar69,auVar68);
        auVar65 = vunpckhps_avx(auVar69,auVar68);
        auVar74 = vunpcklps_avx(auVar75,auVar67);
        auVar14 = vunpckhps_avx(auVar75,auVar67);
        auVar66 = vunpcklpd_avx(auVar70,auVar11);
        auVar11 = vunpckhpd_avx(auVar70,auVar11);
        auVar69 = vunpcklpd_avx(auVar63,auVar64);
        auVar63 = vunpckhpd_avx(auVar63,auVar64);
        auVar68 = vunpcklpd_avx(auVar71,auVar73);
        auVar64 = vunpckhpd_avx(auVar71,auVar73);
        auVar75 = vunpcklpd_avx(auVar12,auVar13);
        auVar12 = vunpckhpd_avx(auVar12,auVar13);
        auVar67 = vunpcklpd_avx(auVar72,auVar74);
        auVar13 = vunpckhpd_avx(auVar72,auVar74);
        auVar70 = vunpcklpd_avx(auVar65,auVar14);
        auVar65 = vunpckhpd_avx(auVar65,auVar14);
        auVar71._16_16_ = auVar68._0_16_;
        auVar71._0_16_ = auVar66._0_16_;
        auVar14 = vperm2f128_avx(auVar66,auVar68,0x31);
        auVar73._16_16_ = auVar11._0_16_;
        auVar73._0_16_ = auVar67._0_16_;
        auVar11 = vperm2f128_avx(auVar67,auVar11,0x31);
        auVar66._16_16_ = auVar13._0_16_;
        auVar66._0_16_ = auVar64._0_16_;
        auVar64 = vperm2f128_avx(auVar64,auVar13,0x31);
        auVar68._16_16_ = auVar75._0_16_;
        auVar68._0_16_ = auVar69._0_16_;
        auVar13 = vperm2f128_avx(auVar69,auVar75,0x31);
        auVar75._16_16_ = auVar63._0_16_;
        auVar75._0_16_ = auVar70._0_16_;
        auVar63 = vperm2f128_avx(auVar70,auVar63,0x31);
        auVar69._16_16_ = auVar65._0_16_;
        auVar69._0_16_ = auVar12._0_16_;
        auVar12 = vperm2f128_avx(auVar12,auVar65,0x31);
        *pauVar48 = auVar71;
        pauVar48[1] = auVar73;
        pauVar48[2] = auVar66;
        pauVar48[3] = auVar68;
        pauVar48[4] = auVar75;
        pauVar48[5] = auVar69;
        pauVar48[6] = auVar14;
        pauVar48[7] = auVar11;
        pauVar48[8] = auVar64;
        pauVar48[9] = auVar13;
        pauVar48[10] = auVar63;
        pauVar48[0xb] = auVar12;
        pauVar48 = pauVar48 + 0xc;
        lVar44 = lVar44 + 0x20;
        pvVar37 = (void *)((long)pvVar37 + 0x20);
        lVar45 = lVar45 + 8;
      }
      for (; iVar51 + 3 < max_kk; iVar51 = iVar51 + 4) {
        auVar25 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_148),
                                *(undefined1 (*) [16])((long)pvVar37 + local_140));
        auVar26 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_128),
                                *(undefined1 (*) [16])((long)pvVar37 + local_120));
        auVar20 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_148),
                                *(undefined1 (*) [16])((long)pvVar37 + local_140));
        auVar21 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_128),
                                *(undefined1 (*) [16])((long)pvVar37 + local_120));
        auVar16 = vmovlhps_avx(auVar25,auVar26);
        auVar17 = vunpckhpd_avx(auVar25,auVar26);
        auVar25 = vmovlhps_avx(auVar20,auVar21);
        auVar18 = vunpckhpd_avx(auVar20,auVar21);
        auVar21 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_d8),
                                *(undefined1 (*) [16])((long)pvVar37 + local_d0));
        auVar27 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_c8),
                                *(undefined1 (*) [16])((long)pvVar37 + local_c0));
        auVar26 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_d8),
                                *(undefined1 (*) [16])((long)pvVar37 + local_d0));
        auVar22 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar37 + local_c8),
                                *(undefined1 (*) [16])((long)pvVar37 + local_c0));
        auVar20 = vmovlhps_avx(auVar21,auVar27);
        auVar27 = vunpckhpd_avx(auVar21,auVar27);
        auVar21 = vmovlhps_avx(auVar26,auVar22);
        auVar19 = vunpckhpd_avx(auVar26,auVar22);
        auVar22 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar37 + lVar57),
                                *(undefined1 (*) [16])((long)pvVar37 + lVar47));
        auVar28 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar37 + lVar60),
                                *(undefined1 (*) [16])((long)pvVar37 + lVar59));
        auVar23 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar37 + lVar57),
                                *(undefined1 (*) [16])((long)pvVar37 + lVar47));
        auVar24 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar37 + lVar60),
                                *(undefined1 (*) [16])((long)pvVar37 + lVar59));
        auVar26 = vmovlhps_avx(auVar22,auVar28);
        auVar28 = vunpckhpd_avx(auVar22,auVar28);
        auVar22 = vmovlhps_avx(auVar23,auVar24);
        auVar23 = vunpckhpd_avx(auVar23,auVar24);
        *(undefined1 (*) [16])*pauVar48 = auVar16;
        *(undefined1 (*) [16])(*pauVar48 + 0x10) = auVar20;
        *(undefined1 (*) [16])pauVar48[1] = auVar26;
        *(undefined1 (*) [16])(pauVar48[1] + 0x10) = auVar17;
        *(undefined1 (*) [16])pauVar48[2] = auVar27;
        *(undefined1 (*) [16])(pauVar48[2] + 0x10) = auVar28;
        *(undefined1 (*) [16])pauVar48[3] = auVar25;
        *(undefined1 (*) [16])(pauVar48[3] + 0x10) = auVar21;
        *(undefined1 (*) [16])pauVar48[4] = auVar22;
        *(undefined1 (*) [16])(pauVar48[4] + 0x10) = auVar18;
        *(undefined1 (*) [16])pauVar48[5] = auVar19;
        *(undefined1 (*) [16])(pauVar48[5] + 0x10) = auVar23;
        pauVar48 = pauVar48 + 6;
        pvVar37 = (void *)((long)pvVar37 + 0x10);
        lVar45 = lVar45 + 4;
      }
      for (; (int)lVar45 < max_kk; lVar45 = lVar45 + 1) {
        puVar8 = (undefined4 *)((long)pvVar36 + lVar45 * 4 + local_148);
        *(undefined4 *)*pauVar48 = *puVar8;
        *(undefined4 *)(*pauVar48 + 4) = puVar8[lVar58];
        *(undefined4 *)(*pauVar48 + 8) = puVar8[lVar58 * 2];
        *(undefined4 *)(*pauVar48 + 0xc) = puVar8[lVar58 * 3];
        *(undefined4 *)(*pauVar48 + 0x10) = puVar8[lVar58 * 4];
        *(undefined4 *)(*pauVar48 + 0x14) = puVar8[lVar58 * 5];
        *(undefined4 *)(*pauVar48 + 0x18) = puVar8[lVar58 * 6];
        *(undefined4 *)(*pauVar48 + 0x1c) = puVar8[lVar58 * 7];
        *(undefined4 *)pauVar48[1] = puVar8[lVar58 * 8];
        *(undefined4 *)(pauVar48[1] + 4) = puVar8[lVar58 * 9];
        *(undefined4 *)(pauVar48[1] + 8) = puVar8[lVar58 * 10];
        *(undefined4 *)(pauVar48[1] + 0xc) = puVar8[lVar58 * 0xb];
        pauVar48 = (undefined1 (*) [32])(pauVar48[1] + 0x10);
      }
    }
    local_148 = local_148 + lVar35;
    local_140 = local_140 + lVar35;
    local_128 = local_128 + lVar35;
    local_120 = local_120 + lVar35;
    lVar49 = lVar49 + lVar35;
    lVar46 = lVar46 + lVar35;
    local_d8 = local_d8 + lVar35;
    local_d0 = local_d0 + lVar35;
    local_c8 = local_c8 + lVar35;
    local_c0 = local_c0 + lVar35;
    lVar61 = lVar61 + lVar35;
    local_a0 = local_a0 + lVar35;
    lVar59 = lVar59 + lVar35;
    lVar60 = lVar60 + lVar35;
    lVar47 = lVar47 + lVar35;
    lVar57 = lVar57 + lVar35;
  }
  iVar33 = iVar33 * 8;
  lVar38 = lVar58 * 0x20;
  for (; (long)uVar55 < lVar34 + -7; uVar55 = uVar55 + 8) {
    if (iVar15 == 8) {
      pvVar36 = B->data;
      iVar32 = (int)uVar55 + j;
      pauVar43 = (undefined1 (*) [32])
                 ((long)pvVar36 + lVar42 * 4 + (long)((iVar32 / 8) * iVar33) * 4);
      iVar51 = iVar50;
      if (iVar32 % 8 == 0) {
        while (iVar51 != 0) {
          *pauVar48 = *pauVar43;
          pauVar48 = pauVar48 + 1;
          pauVar43 = pauVar43 + 1;
          iVar51 = iVar51 + -1;
        }
      }
      if (iVar32 % 8 == 4) {
        lVar39 = 0;
        iVar51 = iVar50;
        while (bVar62 = iVar51 != 0, iVar51 = iVar51 + -1, bVar62) {
          uVar29 = *(undefined8 *)((long)(*pauVar43 + lVar39 + 0x10) + 8);
          *(undefined8 *)(*pauVar48 + lVar39) = *(undefined8 *)(*pauVar43 + lVar39 + 0x10);
          *(undefined8 *)((long)(*pauVar48 + lVar39) + 8) = uVar29;
          *(undefined1 (*) [16])(*pauVar48 + lVar39 + 0x10) =
               *(undefined1 (*) [16])
                ((long)pvVar36 + lVar39 + lVar42 * 4 + (long)(((iVar32 + 8) / 8) * iVar33) * 4);
          lVar39 = lVar39 + 0x20;
        }
        pauVar48 = (undefined1 (*) [32])(*pauVar48 + lVar39);
      }
    }
    if (iVar15 == 4) {
      pvVar36 = B->data;
      iVar51 = iVar50;
      while (bVar62 = iVar51 != 0, iVar51 = iVar51 + -1, bVar62) {
        uVar29 = ((undefined8 *)((long)pvVar36 + lVar46))[1];
        *(undefined8 *)*pauVar48 = *(undefined8 *)((long)pvVar36 + lVar46);
        *(undefined8 *)(*pauVar48 + 8) = uVar29;
        *(undefined1 (*) [16])(*pauVar48 + 0x10) = *(undefined1 (*) [16])((long)pvVar36 + lVar49);
        pauVar48 = pauVar48 + 1;
        pvVar36 = (void *)((long)pvVar36 + 0x10);
      }
    }
    pauVar43 = pauVar48;
    if (iVar15 == 1) {
      pvVar36 = B->data;
      lVar39 = 0;
      lVar54 = 0;
      for (iVar51 = 0; iVar51 + 7 < max_kk; iVar51 = iVar51 + 8) {
        auVar11 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_148);
        auVar63 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_140);
        auVar64 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_128);
        auVar12 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_120);
        auVar13 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_d8);
        auVar65 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_d0);
        auVar14 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_c8);
        auVar66 = *(undefined1 (*) [32])((long)pvVar36 + lVar54 + local_c0);
        auVar69 = vunpcklps_avx(auVar11,auVar63);
        auVar63 = vunpckhps_avx(auVar11,auVar63);
        auVar11 = vunpcklps_avx(auVar64,auVar12);
        auVar64 = vunpckhps_avx(auVar64,auVar12);
        auVar68 = vunpcklps_avx(auVar13,auVar65);
        auVar12 = vunpckhps_avx(auVar13,auVar65);
        auVar75 = vunpcklps_avx(auVar14,auVar66);
        auVar13 = vunpckhps_avx(auVar14,auVar66);
        auVar65 = vunpcklpd_avx(auVar69,auVar11);
        auVar11 = vunpckhpd_avx(auVar69,auVar11);
        auVar14 = vunpcklpd_avx(auVar63,auVar64);
        auVar63 = vunpckhpd_avx(auVar63,auVar64);
        auVar66 = vunpcklpd_avx(auVar68,auVar75);
        auVar64 = vunpckhpd_avx(auVar68,auVar75);
        auVar69 = vunpcklpd_avx(auVar12,auVar13);
        auVar12 = vunpckhpd_avx(auVar12,auVar13);
        auVar67._16_16_ = auVar66._0_16_;
        auVar67._0_16_ = auVar65._0_16_;
        auVar70._16_16_ = auVar64._0_16_;
        auVar70._0_16_ = auVar11._0_16_;
        auVar72._16_16_ = auVar69._0_16_;
        auVar72._0_16_ = auVar14._0_16_;
        auVar74._16_16_ = auVar12._0_16_;
        auVar74._0_16_ = auVar63._0_16_;
        auVar13 = vperm2f128_avx(auVar65,auVar66,0x31);
        auVar11 = vperm2f128_avx(auVar11,auVar64,0x31);
        auVar64 = vperm2f128_avx(auVar14,auVar69,0x31);
        auVar63 = vperm2f128_avx(auVar63,auVar12,0x31);
        *(undefined1 (*) [32])(*pauVar48 + lVar54 * 8) = auVar67;
        *(undefined1 (*) [32])(pauVar48[1] + lVar54 * 8) = auVar70;
        *(undefined1 (*) [32])(pauVar48[2] + lVar54 * 8) = auVar72;
        *(undefined1 (*) [32])(pauVar48[3] + lVar54 * 8) = auVar74;
        *(undefined1 (*) [32])(pauVar48[4] + lVar54 * 8) = auVar13;
        *(undefined1 (*) [32])(pauVar48[5] + lVar54 * 8) = auVar11;
        *(undefined1 (*) [32])(pauVar48[6] + lVar54 * 8) = auVar64;
        *(undefined1 (*) [32])(pauVar48[7] + lVar54 * 8) = auVar63;
        pauVar43 = pauVar43 + 8;
        lVar54 = lVar54 + 0x20;
        lVar39 = lVar39 + 8;
      }
      for (; iVar51 + 3 < max_kk; iVar51 = iVar51 + 4) {
        auVar16 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_148);
        auVar25 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_140);
        auVar20 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_128);
        auVar21 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_120);
        auVar26 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_d8);
        auVar22 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_d0);
        auVar17 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_c8);
        auVar18 = *(undefined1 (*) [16])((long)pvVar36 + lVar54 + local_c0);
        auVar27 = vunpcklps_avx(auVar16,auVar25);
        auVar28 = vunpcklps_avx(auVar20,auVar21);
        auVar19 = vunpckhps_avx(auVar16,auVar25);
        auVar20 = vunpckhps_avx(auVar20,auVar21);
        auVar16 = vmovlhps_avx(auVar27,auVar28);
        auVar27 = vunpckhpd_avx(auVar27,auVar28);
        auVar25 = vmovlhps_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar21 = vunpcklps_avx(auVar26,auVar22);
        auVar28 = vunpcklps_avx(auVar17,auVar18);
        auVar22 = vunpckhps_avx(auVar26,auVar22);
        auVar17 = vunpckhps_avx(auVar17,auVar18);
        auVar20 = vmovlhps_avx(auVar21,auVar28);
        auVar26 = vunpckhpd_avx(auVar21,auVar28);
        auVar21 = vmovlhps_avx(auVar22,auVar17);
        auVar22 = vunpckhpd_avx(auVar22,auVar17);
        *(undefined1 (*) [16])(*pauVar48 + lVar54 * 8) = auVar16;
        *(undefined1 (*) [16])(*pauVar48 + lVar54 * 8 + 0x10) = auVar20;
        *(undefined1 (*) [16])(pauVar48[1] + lVar54 * 8) = auVar27;
        *(undefined1 (*) [16])(pauVar48[1] + lVar54 * 8 + 0x10) = auVar26;
        *(undefined1 (*) [16])(pauVar48[2] + lVar54 * 8) = auVar25;
        *(undefined1 (*) [16])(pauVar48[2] + lVar54 * 8 + 0x10) = auVar21;
        *(undefined1 (*) [16])(pauVar48[3] + lVar54 * 8) = auVar19;
        *(undefined1 (*) [16])(pauVar48[3] + lVar54 * 8 + 0x10) = auVar22;
        pauVar43 = pauVar43 + 4;
        lVar54 = lVar54 + 0x10;
        lVar39 = lVar39 + 4;
      }
      for (; (int)lVar39 < max_kk; lVar39 = lVar39 + 1) {
        puVar8 = (undefined4 *)((long)pvVar36 + lVar39 * 4 + local_148);
        *(undefined4 *)*pauVar43 = *puVar8;
        *(undefined4 *)(*pauVar43 + 4) = puVar8[lVar58];
        *(undefined4 *)(*pauVar43 + 8) = puVar8[lVar58 * 2];
        *(undefined4 *)(*pauVar43 + 0xc) = puVar8[lVar58 * 3];
        *(undefined4 *)(*pauVar43 + 0x10) = puVar8[lVar58 * 4];
        *(undefined4 *)(*pauVar43 + 0x14) = puVar8[lVar58 * 5];
        *(undefined4 *)(*pauVar43 + 0x18) = puVar8[lVar58 * 6];
        *(undefined4 *)(*pauVar43 + 0x1c) = puVar8[lVar58 * 7];
        pauVar43 = pauVar43 + 1;
      }
    }
    local_148 = local_148 + lVar38;
    local_140 = local_140 + lVar38;
    local_128 = local_128 + lVar38;
    local_120 = local_120 + lVar38;
    lVar49 = lVar49 + lVar38;
    lVar46 = lVar46 + lVar38;
    local_d8 = local_d8 + lVar38;
    local_d0 = local_d0 + lVar38;
    local_c8 = local_c8 + lVar38;
    local_c0 = local_c0 + lVar38;
    pauVar48 = pauVar43;
  }
  lVar38 = lVar58 * 0x10;
  for (; (long)(uVar55 | 3) < lVar34; uVar55 = uVar55 + 4) {
    if (iVar15 == 8) {
      iVar51 = j + (int)uVar55;
      iVar32 = iVar51 % 8;
      pauVar40 = (undefined1 (*) [16])
                 ((long)B->data + lVar42 * 4 + (long)((iVar51 / 8) * iVar33) * 4);
      iVar51 = iVar50;
      if (iVar32 == 0) {
        while (iVar51 != 0) {
          *(undefined1 (*) [16])*pauVar48 = *pauVar40;
          pauVar48 = (undefined1 (*) [32])(*pauVar48 + 0x10);
          pauVar40 = pauVar40 + 2;
          iVar51 = iVar51 + -1;
        }
      }
      if (iVar32 == 4) {
        pauVar40 = pauVar40 + 1;
        iVar51 = iVar50;
        while (bVar62 = iVar51 != 0, iVar51 = iVar51 + -1, bVar62) {
          *(undefined1 (*) [16])*pauVar48 = *pauVar40;
          pauVar48 = (undefined1 (*) [32])(*pauVar48 + 0x10);
          pauVar40 = pauVar40 + 2;
        }
      }
    }
    if (iVar15 == 4) {
      pauVar40 = (undefined1 (*) [16])
                 ((long)B->data + (long)(k * 4) * 4 + (uVar55 + lVar56) * lVar58 * 4);
      iVar51 = iVar50;
      while (bVar62 = iVar51 != 0, iVar51 = iVar51 + -1, bVar62) {
        *(undefined1 (*) [16])*pauVar48 = *pauVar40;
        pauVar48 = (undefined1 (*) [32])(*pauVar48 + 0x10);
        pauVar40 = pauVar40 + 1;
      }
    }
    pauVar43 = pauVar48;
    if (iVar15 == 1) {
      pvVar36 = B->data;
      lVar39 = 0;
      for (iVar51 = 0; iVar51 + 7 < max_kk; iVar51 = iVar51 + 8) {
        auVar11 = *(undefined1 (*) [32])((long)pvVar36 + lVar39 + local_148);
        auVar63 = *(undefined1 (*) [32])((long)pvVar36 + lVar39 + local_140);
        auVar64 = *(undefined1 (*) [32])((long)pvVar36 + lVar39 + local_128);
        auVar12 = *(undefined1 (*) [32])((long)pvVar36 + lVar39 + local_120);
        auVar13 = vunpcklps_avx(auVar11,auVar63);
        auVar63 = vunpckhps_avx(auVar11,auVar63);
        auVar11 = vunpcklps_avx(auVar64,auVar12);
        auVar64 = vunpckhps_avx(auVar64,auVar12);
        auVar12 = vunpcklpd_avx(auVar13,auVar11);
        auVar11 = vunpckhpd_avx(auVar13,auVar11);
        auVar13 = vunpcklpd_avx(auVar63,auVar64);
        auVar63 = vunpckhpd_avx(auVar63,auVar64);
        auVar64._16_16_ = auVar11._0_16_;
        auVar64._0_16_ = auVar12._0_16_;
        auVar65._16_16_ = auVar63._0_16_;
        auVar65._0_16_ = auVar13._0_16_;
        auVar11 = vperm2f128_avx(auVar12,auVar11,0x31);
        auVar63 = vperm2f128_avx(auVar13,auVar63,0x31);
        *(undefined1 (*) [32])(*pauVar48 + lVar39 * 4) = auVar64;
        *(undefined1 (*) [32])(pauVar48[1] + lVar39 * 4) = auVar65;
        *(undefined1 (*) [32])(pauVar48[2] + lVar39 * 4) = auVar11;
        *(undefined1 (*) [32])(pauVar48[3] + lVar39 * 4) = auVar63;
        pauVar43 = pauVar43 + 4;
        lVar39 = lVar39 + 0x20;
      }
      for (; iVar51 + 3 < max_kk; iVar51 = iVar51 + 4) {
        auVar16 = *(undefined1 (*) [16])((long)pvVar36 + lVar39 + local_148);
        auVar25 = *(undefined1 (*) [16])((long)pvVar36 + lVar39 + local_140);
        auVar20 = *(undefined1 (*) [16])((long)pvVar36 + lVar39 + local_128);
        auVar21 = *(undefined1 (*) [16])((long)pvVar36 + lVar39 + local_120);
        auVar22 = vunpcklps_avx(auVar16,auVar25);
        auVar17 = vunpcklps_avx(auVar20,auVar21);
        auVar26 = vunpckhps_avx(auVar16,auVar25);
        auVar21 = vunpckhps_avx(auVar20,auVar21);
        auVar16 = vmovlhps_avx(auVar22,auVar17);
        auVar20 = vunpckhpd_avx(auVar22,auVar17);
        auVar25 = vmovlhps_avx(auVar26,auVar21);
        auVar21 = vunpckhpd_avx(auVar26,auVar21);
        *(undefined1 (*) [16])(*pauVar48 + lVar39 * 4) = auVar16;
        *(undefined1 (*) [16])(*pauVar48 + lVar39 * 4 + 0x10) = auVar20;
        *(undefined1 (*) [16])(pauVar48[1] + lVar39 * 4) = auVar25;
        *(undefined1 (*) [16])(pauVar48[1] + lVar39 * 4 + 0x10) = auVar21;
        pauVar43 = pauVar43 + 2;
        lVar39 = lVar39 + 0x10;
      }
      for (; iVar51 < max_kk; iVar51 = iVar51 + 1) {
        *(undefined4 *)(*pauVar48 + lVar39 * 4) =
             *(undefined4 *)((long)pvVar36 + lVar39 + local_148);
        *(undefined4 *)(*pauVar48 + lVar39 * 4 + 4) =
             *(undefined4 *)((long)pvVar36 + lVar39 + local_140);
        *(undefined4 *)(*pauVar48 + lVar39 * 4 + 8) =
             *(undefined4 *)((long)pvVar36 + lVar39 + local_128);
        *(undefined4 *)(*pauVar48 + lVar39 * 4 + 0xc) =
             *(undefined4 *)((long)pvVar36 + lVar39 + local_120);
        pauVar43 = (undefined1 (*) [32])(*pauVar43 + 0x10);
        lVar39 = lVar39 + 4;
      }
    }
    local_148 = local_148 + lVar38;
    local_140 = local_140 + lVar38;
    local_128 = local_128 + lVar38;
    local_120 = local_120 + lVar38;
    pauVar48 = pauVar43;
  }
  for (; (long)(uVar55 | 1) < lVar34; uVar55 = uVar55 + 2) {
    pvVar36 = B->data;
    lVar38 = 0;
    lVar39 = 0;
    pauVar43 = pauVar48;
    for (iVar33 = 0; iVar33 + 7 < max_kk; iVar33 = iVar33 + 8) {
      auVar11 = *(undefined1 (*) [32])((long)pvVar36 + lVar39 + local_148);
      auVar63 = *(undefined1 (*) [32])((long)pvVar36 + lVar39 + local_140);
      auVar64 = vunpcklps_avx(auVar11,auVar63);
      auVar11 = vunpckhps_avx(auVar11,auVar63);
      auVar63._16_16_ = auVar11._0_16_;
      auVar63._0_16_ = auVar64._0_16_;
      auVar11 = vperm2f128_avx(auVar64,auVar11,0x31);
      *(undefined1 (*) [32])(*pauVar48 + lVar39 * 2) = auVar63;
      *(undefined1 (*) [32])(pauVar48[1] + lVar39 * 2) = auVar11;
      pauVar43 = pauVar43 + 2;
      lVar39 = lVar39 + 0x20;
      lVar38 = lVar38 + 8;
    }
    for (; iVar33 + 3 < max_kk; iVar33 = iVar33 + 4) {
      auVar16 = *(undefined1 (*) [16])((long)pvVar36 + lVar39 + local_148);
      auVar25 = *(undefined1 (*) [16])((long)pvVar36 + lVar39 + local_140);
      auVar20 = vunpcklps_avx(auVar16,auVar25);
      auVar16 = vunpckhps_avx(auVar16,auVar25);
      *(undefined1 (*) [16])(*pauVar48 + lVar39 * 2) = auVar20;
      *(undefined1 (*) [16])(*pauVar48 + lVar39 * 2 + 0x10) = auVar16;
      pauVar43 = pauVar43 + 1;
      lVar39 = lVar39 + 0x10;
      lVar38 = lVar38 + 4;
    }
    for (; (int)lVar38 < max_kk; lVar38 = lVar38 + 1) {
      *(undefined4 *)*pauVar43 = *(undefined4 *)((long)pvVar36 + lVar38 * 4 + local_148);
      *(undefined4 *)(*pauVar43 + 4) = *(undefined4 *)((long)pvVar36 + lVar38 * 4 + local_140);
      pauVar43 = (undefined1 (*) [32])(*pauVar43 + 8);
    }
    local_148 = local_148 + lVar58 * 8;
    local_140 = local_140 + lVar58 * 8;
    pauVar48 = pauVar43;
  }
  for (; (long)uVar55 < lVar34; uVar55 = uVar55 + 1) {
    pvVar36 = B->data;
    pauVar43 = (undefined1 (*) [32])((long)pvVar36 + (long)k * 4 + (uVar55 + lVar56) * lVar58 * 4);
    lVar38 = 0;
    for (iVar33 = 0; iVar33 + 7 < max_kk; iVar33 = iVar33 + 8) {
      *pauVar48 = *pauVar43;
      pauVar48 = pauVar48 + 1;
      pauVar43 = pauVar43 + 1;
      lVar38 = lVar38 + 8;
    }
    for (; iVar33 + 3 < max_kk; iVar33 = iVar33 + 4) {
      *(undefined1 (*) [16])*pauVar48 = *(undefined1 (*) [16])*pauVar43;
      pauVar48 = (undefined1 (*) [32])(*pauVar48 + 0x10);
      pauVar43 = (undefined1 (*) [32])(*pauVar43 + 0x10);
      lVar38 = lVar38 + 4;
    }
    for (; (int)lVar38 < max_kk; lVar38 = lVar38 + 1) {
      *(undefined4 *)*pauVar48 = *(undefined4 *)((long)pvVar36 + lVar38 * 4 + local_148);
      pauVar48 = (undefined1 (*) [32])(*pauVar48 + 4);
    }
    local_148 = local_148 + lVar58 * 4;
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}